

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_url(URLGlob **glob,char *url,curl_off_t *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  anon_union_40_3_e2f18bb4_for_content *paVar2;
  byte bVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  URLGlob *glob_00;
  long lVar8;
  char **ppcVar9;
  char *__dest;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *__s;
  anon_union_40_3_e2f18bb4_for_content *paVar21;
  bool bVar22;
  CURLcode local_284;
  byte *local_278;
  char end_c;
  char max_c;
  char min_c;
  long local_268;
  int local_25c;
  FILE *local_258;
  long *local_250;
  byte *local_248;
  URLGlob **local_240;
  char hostname [128];
  
  *glob = (URLGlob *)0x0;
  local_258 = error;
  local_250 = urlnum;
  local_248 = (byte *)url;
  local_240 = glob;
  sVar6 = strlen(url);
  pcVar7 = (char *)malloc(sVar6 + 1);
  if (pcVar7 != (char *)0x0) {
    *pcVar7 = '\0';
    local_268 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar6;
      glob_00->glob_buffer = pcVar7;
      local_278 = (byte *)0x1;
      local_284 = CURLE_OK;
      local_25c = 0;
      __s = local_248;
LAB_0011cf81:
      if ((*__s != 0) && (local_284 == CURLE_OK)) {
        pbVar19 = (byte *)glob_00->glob_buffer;
        sVar6 = 0;
        while( true ) {
          for (; bVar3 = *__s, bVar3 == 0x5b; __s = __s + (long)pcVar7) {
            pcVar7 = strchr((char *)__s,0x5d);
            if (((pcVar7 == (char *)0x0) ||
                (pcVar7 = pcVar7 + (1 - (long)__s), (char *)0x7f < pcVar7)) ||
               (lVar8 = curl_url(), lVar8 == 0)) {
              pcVar7 = (char *)0x0;
              bVar22 = false;
            }
            else {
              memcpy(hostname,__s,(size_t)pcVar7);
              hostname[(long)pcVar7] = '\0';
              iVar5 = curl_url_set(lVar8,0,hostname,0x200);
              curl_url_cleanup(lVar8);
              bVar22 = iVar5 == 0;
              if (!bVar22) {
                pcVar7 = (char *)0x0;
              }
            }
            if ((!bVar22) && (__s[1] == 0x5d)) {
              pcVar7 = (char *)0x2;
            }
            if (pcVar7 == (char *)0x0) goto LAB_0011d0d0;
            memcpy(pbVar19,__s,(size_t)pcVar7);
            pbVar19 = pbVar19 + (long)pcVar7;
            sVar6 = sVar6 + (long)pcVar7;
          }
          if (0x5c < bVar3) break;
          if (bVar3 == 0) goto LAB_0011d0d0;
          if (((bVar3 == 0x5c) && (__s[1] - 0x5b < 0x23)) &&
             ((0x500000005U >> ((ulong)(__s[1] - 0x5b) & 0x3f) & 1) != 0)) {
            __s = __s + 1;
            local_278 = local_278 + 1;
          }
LAB_0011d0b3:
          bVar3 = *__s;
          __s = __s + 1;
          *pbVar19 = bVar3;
          pbVar19 = pbVar19 + 1;
          local_278 = local_278 + 1;
          sVar6 = sVar6 + 1;
        }
        if (bVar3 == 0x5d) {
LAB_0011d17c:
          pcVar7 = "unmatched close brace/bracket";
          goto LAB_0011d7b8;
        }
        if (bVar3 != 0x7b) {
          if (bVar3 != 0x7d) goto LAB_0011d0b3;
          goto LAB_0011d17c;
        }
LAB_0011d0d0:
        pbVar17 = __s;
        pbVar14 = local_278;
        if (sVar6 == 0) {
          if (*__s != 0x5b) {
            if (*__s == 0x7b) {
              pbVar17 = __s + 1;
              sVar4 = glob_00->size;
              pbVar19 = (byte *)glob_00->glob_buffer;
              glob_00->pattern[sVar4].type = UPTSet;
              paVar21 = &glob_00->pattern[sVar4].content;
              paVar2 = &glob_00->pattern[sVar4].content;
              (paVar2->Set).elements = (char **)0x0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->min_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->max_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->ptr_c = '\0';
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->field_0x3 = 0;
              ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->step = 0;
              glob_00->pattern[sVar4].content.Set.ptr_s = 0;
              glob_00->pattern[sVar4].globindex = local_25c;
              local_25c = local_25c + 1;
              pbVar13 = local_278;
              pbVar20 = pbVar17;
              do {
                pbVar14 = pbVar13 + 1;
                bVar3 = *pbVar20;
                if (bVar3 < 0x5c) {
                  if (bVar3 != 0x2c) {
                    if (bVar3 != 0) {
                      if (bVar3 != 0x5b) goto LAB_0011d36b;
LAB_0011d60a:
                      pcVar7 = "nested brace";
                      goto LAB_0011d77b;
                    }
                    glob_00->error = "unmatched brace";
                    glob_00->pos = (size_t)local_278;
                    goto LAB_0011d78b;
                  }
LAB_0011d2a3:
                  *pbVar19 = 0;
                  if ((paVar21->Set).elements == (char **)0x0) {
                    ppcVar9 = (char **)malloc(8);
                    (paVar21->Set).elements = ppcVar9;
                  }
                  else {
                    ppcVar9 = (char **)realloc((paVar21->Set).elements,
                                               glob_00->pattern[sVar4].content.Set.size * 8 + 8);
                    if (ppcVar9 == (char **)0x0) {
                      glob_00->error = "out of memory";
                      glob_00->pos = 0;
                      local_284 = CURLE_OUT_OF_MEMORY;
                      break;
                    }
                    (paVar21->Set).elements = ppcVar9;
                  }
                  ppcVar9 = (paVar21->Set).elements;
                  if (ppcVar9 == (char **)0x0) {
LAB_0011d5b7:
                    glob_00->error = "out of memory";
                    glob_00->pos = 0;
                    local_284 = CURLE_OUT_OF_MEMORY;
                    break;
                  }
                  pcVar7 = strdup(glob_00->glob_buffer);
                  ppcVar9[glob_00->pattern[sVar4].content.Set.size] = pcVar7;
                  lVar8 = glob_00->pattern[sVar4].content.Set.size;
                  if (glob_00->pattern[sVar4].content.Set.elements[lVar8] == (char *)0x0)
                  goto LAB_0011d5b7;
                  glob_00->pattern[sVar4].content.Set.size = lVar8 + 1;
                  if (*pbVar20 == 0x7d) {
                    pbVar17 = pbVar20 + 1;
                    local_284 = CURLE_OK;
                    break;
                  }
                  pbVar19 = (byte *)glob_00->glob_buffer;
                  pbVar13 = pbVar14;
                }
                else {
                  if (bVar3 < 0x7b) {
                    if (bVar3 == 0x5c) {
                      if (pbVar20[1] != 0) {
                        pbVar20 = pbVar20 + 1;
                        pbVar14 = pbVar13 + 2;
                      }
                    }
                    else if (bVar3 == 0x5d) goto LAB_0011d6ef;
                  }
                  else {
                    if (bVar3 == 0x7d) {
                      if (pbVar17 != pbVar20) {
                        lVar8 = glob_00->pattern[sVar4].content.Set.size;
                        if (lVar8 < 0) {
                          local_268 = 0;
                        }
                        else {
                          bVar22 = local_268 < 1;
                          local_268 = (lVar8 + 1) * local_268;
                          if (bVar22) {
                            local_268 = 0;
                          }
                        }
                        goto LAB_0011d2a3;
                      }
                      pcVar7 = "empty string within braces";
                      goto LAB_0011d77b;
                    }
                    if (bVar3 == 0x7b) goto LAB_0011d60a;
                  }
LAB_0011d36b:
                  *pbVar19 = *pbVar20;
                  pbVar19 = pbVar19 + 1;
                  pbVar13 = pbVar14;
                }
                pbVar20 = pbVar20 + 1;
              } while( true );
            }
            goto LAB_0011d793;
          }
          pbVar19 = __s + 1;
          pbVar14 = local_278 + 1;
          pUVar1 = glob_00->pattern + glob_00->size;
          glob_00->pattern[glob_00->size].globindex = local_25c;
          local_25c = local_25c + 1;
          if ((byte)((__s[1] & 0xdf) + 0xbf) < 0x1a) {
            pUVar1->type = UPTCharRange;
            iVar5 = __isoc99_sscanf(pbVar19,"%c-%c%c",&min_c,&max_c,&end_c);
            uVar16 = 1;
            bVar22 = true;
            pbVar17 = pbVar19;
            if (iVar5 == 3) {
              if (end_c == ']') {
                bVar22 = false;
                pbVar17 = __s + 5;
              }
              else if (end_c == ':') {
                piVar10 = __errno_location();
                *piVar10 = 0;
                uVar16 = strtoul((char *)(__s + 5),(char **)hostname,10);
                if ((*piVar10 == 0) && (__s + 5 != (byte *)hostname._0_8_)) {
                  pbVar17 = (byte *)(hostname._0_8_ + 1);
                  if (*(char *)hostname._0_8_ != ']') {
                    uVar16 = 0;
                    pbVar17 = pbVar19;
                  }
                }
                else {
                  uVar16 = 0;
                }
                bVar22 = false;
              }
            }
            pbVar14 = pbVar17 + ((long)pbVar14 - (long)pbVar19);
            if (((!bVar22) && (0xffffffff80000000 < uVar16 - 0x80000000)) &&
               ((min_c != max_c || (uVar16 == 1)))) {
              if ((min_c == max_c) ||
                 (((min_c <= max_c && (uVar18 = (int)max_c - (int)min_c, (int)uVar18 < 0x1a)) &&
                  (uVar16 <= uVar18)))) {
                (pUVar1->content).CharRange.step = (int)uVar16;
                (pUVar1->content).CharRange.min_c = min_c;
                (pUVar1->content).CharRange.ptr_c = min_c;
                (pUVar1->content).CharRange.max_c = max_c;
                iVar5 = ((int)max_c - (int)min_c) / (int)uVar16;
                if (iVar5 < 0) {
                  local_268 = 0;
                }
                else {
                  bVar22 = local_268 < 1;
                  local_268 = (ulong)(iVar5 + 1) * local_268;
                  if (bVar22) {
                    local_268 = 0;
                  }
                }
                local_284 = CURLE_OK;
                goto LAB_0011d793;
              }
            }
LAB_0011d76f:
            pcVar7 = "bad range";
            goto LAB_0011d77b;
          }
          if ((byte)(__s[1] - 0x30) < 10) {
            pUVar1->type = UPTNumRange;
            (pUVar1->content).Set.ptr_s = 0;
            if (*pbVar19 == 0x30) {
              lVar8 = 2;
              do {
                (pUVar1->content).Set.ptr_s = (int)lVar8 + -1;
                pbVar17 = __s + lVar8;
                lVar8 = lVar8 + 1;
              } while ((byte)(*pbVar17 - 0x30) < 10);
            }
            piVar10 = __errno_location();
            *piVar10 = 0;
            uVar16 = strtoul((char *)pbVar19,(char **)hostname,10);
            pbVar13 = pbVar19;
            if (((*piVar10 == 0) && ((byte *)hostname._0_8_ != pbVar19)) &&
               (pbVar17 = (byte *)hostname._0_8_, *(char *)hostname._0_8_ == '-')) {
              do {
                do {
                  pbVar17 = pbVar17 + 1;
                  bVar3 = *pbVar17;
                } while (bVar3 == 0x20);
              } while (bVar3 == 9);
              pbVar13 = pbVar17;
              if (9 < (byte)(bVar3 - 0x30)) goto LAB_0011d529;
              *piVar10 = 0;
              uVar12 = strtoul((char *)pbVar17,(char **)hostname,10);
              if (*piVar10 == 0) {
                uVar15 = 1;
                if (*(char *)hostname._0_8_ == ':') {
                  pbVar17 = (byte *)(hostname._0_8_ + 1);
                  *piVar10 = 0;
                  uVar15 = strtoul((char *)pbVar17,(char **)hostname,10);
                  if (*piVar10 != 0) {
                    hostname[0] = '\0';
                    hostname[1] = '\0';
                    hostname[2] = '\0';
                    hostname[3] = '\0';
                    hostname[4] = '\0';
                    hostname[5] = '\0';
                    hostname[6] = '\0';
                    hostname[7] = '\0';
                  }
                }
              }
              else {
                hostname[0] = '\0';
                hostname[1] = '\0';
                hostname[2] = '\0';
                hostname[3] = '\0';
                hostname[4] = '\0';
                hostname[5] = '\0';
                hostname[6] = '\0';
                hostname[7] = '\0';
                uVar15 = 0;
              }
              if ((hostname._0_8_ == 0) || (*(char *)hostname._0_8_ != ']')) {
                hostname[0] = '\0';
                hostname[1] = '\0';
                hostname[2] = '\0';
                hostname[3] = '\0';
                hostname[4] = '\0';
                hostname[5] = '\0';
                hostname[6] = '\0';
                hostname[7] = '\0';
              }
              else {
                pbVar17 = (byte *)(hostname._0_8_ + 1);
              }
            }
            else {
LAB_0011d529:
              pbVar17 = pbVar13;
              hostname[0] = '\0';
              hostname[1] = '\0';
              hostname[2] = '\0';
              hostname[3] = '\0';
              hostname[4] = '\0';
              hostname[5] = '\0';
              hostname[6] = '\0';
              hostname[7] = '\0';
              uVar12 = 0;
              uVar15 = 0;
            }
            pbVar14 = pbVar17 + ((long)pbVar14 - (long)pbVar19);
            if (((hostname._0_8_ != 0) && (uVar15 != 0)) && ((uVar12 != uVar16 || (uVar15 == 1)))) {
              uVar11 = uVar12 - uVar16;
              if ((uVar11 == 0) || ((uVar16 <= uVar12 && (uVar15 <= uVar11)))) {
                (pUVar1->content).NumRange.min_n = uVar16;
                (pUVar1->content).NumRange.ptr_n = uVar16;
                (pUVar1->content).Set.size = uVar12;
                (pUVar1->content).NumRange.step = uVar15;
                if ((long)uVar11 / (long)uVar15 < 0) {
                  local_268 = 0;
                }
                else {
                  bVar22 = local_268 < 1;
                  local_268 = ((long)uVar11 / (long)uVar15 + 1) * local_268;
                  if (bVar22) {
                    local_268 = 0;
                  }
                }
                local_284 = CURLE_OK;
                goto LAB_0011d793;
              }
            }
            goto LAB_0011d76f;
          }
          glob_00->error = "bad range specification";
          goto LAB_0011d783;
        }
        *pbVar19 = 0;
        sVar4 = glob_00->size;
        pcVar7 = glob_00->glob_buffer;
        glob_00->pattern[sVar4].type = UPTSet;
        glob_00->pattern[sVar4].globindex = -1;
        glob_00->pattern[sVar4].content.Set.size = 1;
        glob_00->pattern[sVar4].content.Set.ptr_s = 0;
        ppcVar9 = (char **)malloc(8);
        glob_00->pattern[sVar4].content.Set.elements = ppcVar9;
        if (ppcVar9 == (char **)0x0) {
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          local_284 = CURLE_OUT_OF_MEMORY;
        }
        else {
          __dest = (char *)malloc(sVar6 + 1);
          *ppcVar9 = __dest;
          if (__dest == (char *)0x0) {
            glob_00->error = "out of memory";
            glob_00->pos = 0;
            local_284 = CURLE_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,pcVar7,sVar6);
            __dest[sVar6] = '\0';
            local_284 = CURLE_OK;
          }
        }
        goto LAB_0011d793;
      }
      goto LAB_0011d8fb;
    }
    free(pcVar7);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011d6ef:
  pcVar7 = "unexpected close bracket";
LAB_0011d77b:
  glob_00->error = pcVar7;
LAB_0011d783:
  glob_00->pos = (size_t)pbVar14;
LAB_0011d78b:
  local_284 = CURLE_URL_MALFORMAT;
  pbVar17 = __s + 1;
LAB_0011d793:
  uVar16 = glob_00->size + 1;
  glob_00->size = uVar16;
  bVar22 = true;
  pcVar7 = "too many globs";
  __s = pbVar17;
  local_278 = pbVar14;
  if (99 < uVar16) {
LAB_0011d7b8:
    glob_00->error = pcVar7;
    glob_00->pos = (size_t)local_278;
    bVar22 = false;
  }
  if (!bVar22) {
    local_284 = CURLE_URL_MALFORMAT;
LAB_0011d8fb:
    if (local_284 != CURLE_OK) {
      if ((local_258 != (FILE *)0x0) && (pcVar7 = glob_00->error, pcVar7 != (char *)0x0)) {
        sVar4 = glob_00->pos;
        if (sVar4 != 0) {
          curl_msnprintf(hostname,0x200,"%s in URL position %zu:\n%s\n%*s^",pcVar7,sVar4,local_248,
                         (int)sVar4 + -1," ");
          pcVar7 = hostname;
        }
        curl_mfprintf(local_258,"curl: (%d) %s\n",local_284,pcVar7);
      }
      glob_cleanup(glob_00);
      *local_250 = 1;
      return local_284;
    }
    *local_250 = local_268;
    *local_240 = glob_00;
    return CURLE_OK;
  }
  goto LAB_0011cf81;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, curl_off_t *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  curl_off_t amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}